

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::sortByColumn(QTableView *this,int column,SortOrder order)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  SortOrder SVar3;
  QTableViewPrivate *pQVar4;
  SortOrder in_EDX;
  int in_ESI;
  QTableViewPrivate *d;
  
  pQVar4 = d_func((QTableView *)0x8be44f);
  if ((-2 < in_ESI) &&
     ((QHeaderView::setSortIndicator((QHeaderView *)this,column,order),
      (pQVar4->sortingEnabled & 1U) == 0 ||
      ((iVar2 = QHeaderView::sortIndicatorSection((QHeaderView *)CONCAT44(in_ESI,in_EDX)),
       iVar2 == in_ESI &&
       (SVar3 = QHeaderView::sortIndicatorOrder((QHeaderView *)CONCAT44(in_ESI,in_EDX)),
       SVar3 == in_EDX)))))) {
    pQVar1 = (pQVar4->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x140))(pQVar1,in_ESI,in_EDX);
  }
  return;
}

Assistant:

void QTableView::sortByColumn(int column, Qt::SortOrder order)
{
    Q_D(QTableView);
    if (column < -1)
        return;
    d->horizontalHeader->setSortIndicator(column, order);
    // If sorting is not enabled or has the same order as before, force to sort now
    // else sorting will be trigger through sortIndicatorChanged()
    if (!d->sortingEnabled ||
        (d->horizontalHeader->sortIndicatorSection() == column && d->horizontalHeader->sortIndicatorOrder() == order))
        d->model->sort(column, order);
}